

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_fill_unique(lys_module *module,lys_node_list *list,lys_unique *unique,char *value,
                    unres_schema *unres)

{
  int iVar1;
  ushort **ppuVar2;
  char **ppcVar3;
  LY_ERR *pLVar4;
  char *pcVar5;
  undefined8 *item;
  unres_list_uniq *unique_info;
  char *vaux;
  int j;
  int i;
  unres_schema *unres_local;
  char *value_local;
  lys_unique *unique_local;
  lys_node_list *list_local;
  lys_module *module_local;
  
  unique_info = (unres_list_uniq *)value;
  while (unique_info = (unres_list_uniq *)strpbrk((char *)unique_info," \t\n"),
        unique_info != (unres_list_uniq *)0x0) {
    unique->expr_size = unique->expr_size + '\x01';
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)&unique_info->list] & 0x2000) != 0)
    {
      unique_info = (unres_list_uniq *)((long)&unique_info->list + 1);
    }
  }
  unique->expr_size = unique->expr_size + '\x01';
  ppcVar3 = (char **)calloc((ulong)unique->expr_size,8);
  unique->expr = ppcVar3;
  if (unique->expr == (char **)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_unique");
LAB_0016d14f:
    module_local._4_4_ = 1;
  }
  else {
    unres_local = (unres_schema *)value;
    for (vaux._4_4_ = 0; vaux._4_4_ < (int)(uint)unique->expr_size; vaux._4_4_ = vaux._4_4_ + 1) {
      unique_info = (unres_list_uniq *)strpbrk((char *)unres_local," \t\n");
      if (unique_info == (unres_list_uniq *)0x0) {
        unique_info = (unres_list_uniq *)unres_local;
      }
      pcVar5 = lydict_insert(module->ctx,(char *)unres_local,(long)unique_info - (long)unres_local);
      unique->expr[vaux._4_4_] = pcVar5;
      for (vaux._0_4_ = 0; (int)vaux < vaux._4_4_; vaux._0_4_ = (int)vaux + 1) {
        if (unique->expr[(int)vaux] == unique->expr[vaux._4_4_]) {
          ly_vlog(LYE_INARG,LY_VLOG_LYS,list,unique->expr[vaux._4_4_],"unique");
          ly_vlog(LYE_SPEC,LY_VLOG_LYS,list,"The identifier is not unique");
          goto LAB_0016d14f;
        }
      }
      if (unres == (unres_schema *)0x0) {
        iVar1 = resolve_unique((lys_node *)list,unique->expr[vaux._4_4_],&unique->trg_type);
        if (iVar1 != 0) goto LAB_0016d14f;
      }
      else {
        item = (undefined8 *)malloc(0x18);
        *item = list;
        item[1] = unique->expr[vaux._4_4_];
        item[2] = &unique->trg_type;
        iVar1 = unres_schema_add_node(module,unres,item,UNRES_LIST_UNIQ,(lys_node *)0x0);
        if (iVar1 == -1) goto LAB_0016d14f;
      }
      unres_local = (unres_schema *)unique_info;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)&unres_local->item] & 0x2000) != 0
            ) {
        unres_local = (unres_schema *)((long)&unres_local->item + 1);
      }
    }
    module_local._4_4_ = 0;
  }
  return module_local._4_4_;
}

Assistant:

int
yang_fill_unique(struct lys_module *module, struct lys_node_list *list, struct lys_unique *unique, char *value, struct unres_schema *unres)
{
    int i, j;
    char *vaux;
    struct unres_list_uniq *unique_info;

    /* count the number of unique leafs in the value */
    vaux = value;
    while ((vaux = strpbrk(vaux, " \t\n"))) {
       unique->expr_size++;
        while (isspace(*vaux)) {
            vaux++;
        }
    }
    unique->expr_size++;
    unique->expr = calloc(unique->expr_size, sizeof *unique->expr);
    if (!unique->expr) {
        LOGMEM;
        goto error;
    }

    for (i = 0; i < unique->expr_size; i++) {
        vaux = strpbrk(value, " \t\n");
        if (!vaux) {
            /* the last token, lydict_insert() will count its size on its own */
            vaux = value;
        }

        /* store token into unique structure */
        unique->expr[i] = lydict_insert(module->ctx, value, vaux - value);

        /* check that the expression does not repeat */
        for (j = 0; j < i; j++) {
            if (ly_strequal(unique->expr[j], unique->expr[i], 1)) {
                LOGVAL(LYE_INARG, LY_VLOG_LYS, list, unique->expr[i], "unique");
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, list, "The identifier is not unique");
                goto error;
            }
        }
        /* try to resolve leaf */
        if (unres) {
            unique_info = malloc(sizeof *unique_info);
            unique_info->list = (struct lys_node *)list;
            unique_info->expr = unique->expr[i];
            unique_info->trg_type = &unique->trg_type;
            if (unres_schema_add_node(module, unres, unique_info, UNRES_LIST_UNIQ, NULL) == -1) {
                goto error;
            }
        } else {
            if (resolve_unique((struct lys_node *)list, unique->expr[i], &unique->trg_type)) {
                goto error;
            }
        }

        /* move to next token */
        value = vaux;
        while(isspace(*value)) {
            value++;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}